

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

size_t utf8_string_length(utf8_char_t *data,utf8_size_t size)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  if (size == 0) {
    size = utf8_char_count(data,0);
  }
  sVar2 = 0;
  while( true ) {
    bVar3 = size == 0;
    size = size - 1;
    if (bVar3) {
      return sVar2;
    }
    sVar1 = utf8_char_length(data);
    if (sVar1 == 0) break;
    data = data + sVar1;
    sVar2 = sVar2 + sVar1;
  }
  return sVar2;
}

Assistant:

size_t utf8_string_length(const utf8_char_t* data, utf8_size_t size)
{
    size_t char_length, byts = 0;

    if (0 == size) {
        size = utf8_char_count(data, 0);
    }

    for (; 0 < size; --size) {
        if (0 == (char_length = utf8_char_length(data))) {
            break;
        }

        data += char_length;
        byts += char_length;
    }

    return byts;
}